

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::Bind(Polymer *this,Ptr *pol,string *promoter_name)

{
  char cVar1;
  int iVar2;
  pointer pIVar3;
  bool bVar4;
  int iVar5;
  SpeciesTracker *pSVar6;
  runtime_error *this_00;
  element_type *peVar7;
  element_type *peVar8;
  BindingSite *pBVar9;
  pointer pIVar10;
  allocator local_c1;
  Polymer *local_c0;
  Ptr elem;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  __shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [48];
  
  bVar4 = std::operator==(promoter_name,"readthrough");
  if (bVar4) {
    peVar7 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    peVar7->start_ = 1;
    iVar5 = peVar7->footprint_;
    peVar7->stop_ = iVar5;
    peVar7->reading_frame_ = 1;
  }
  else {
    std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               &pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>);
    FindBindingSite((Polymer *)&elem,(Ptr *)this,(string *)local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    peVar7 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar5 = ((elem.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_FixedElement).start_;
    peVar7->start_ = iVar5;
    peVar7->stop_ = iVar5 + -1 + peVar7->footprint_;
    peVar7->reading_frame_ =
         ((elem.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super_FixedElement).reading_frame_;
    bVar4 = std::operator==(&peVar7->name_,"__ribosome");
    if (bVar4) {
      peVar7 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string
                ((string *)(local_60 + 0x10),
                 (string *)
                 &((elem.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_FixedElement).gene_);
      std::__cxx11::string::_M_assign((string *)&peVar7->gene_bound_);
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&elem.super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    peVar7 = (pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar5 = peVar7->stop_;
  }
  if (iVar5 < (this->mask_).super_MobileElement.start_) {
    results.
    super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.
    super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    results.
    super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c0 = this;
    IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
              (&this->binding_sites_,(long)peVar7->start_,(long)iVar5,&results);
    pIVar3 = results.
             super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pIVar10 = results.
                   super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pIVar10 != pIVar3;
        pIVar10 = pIVar10 + 1) {
      peVar8 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar2 = (peVar8->super_FixedElement).covered_;
      iVar5 = iVar2 + 1;
      (peVar8->super_FixedElement).covered_ = iVar5;
      if (-1 < iVar2 && (peVar8->super_FixedElement).old_covered_ == 0) {
        LogCover(local_c0,&(peVar8->super_FixedElement).name_);
        peVar8 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar5 = (peVar8->super_FixedElement).covered_;
      }
      (peVar8->super_FixedElement).old_covered_ = iVar5;
      bVar4 = std::operator!=(&((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->name_,"__rnase");
      if (bVar4) {
        pBVar9 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__cxx11::string::string((string *)&elem,"__ribosome",&local_c1);
        bVar4 = BindingSite::CheckInteraction(pBVar9,(string *)&elem);
        std::__cxx11::string::~string((string *)&elem);
        if (bVar4) {
          pSVar6 = SpeciesTracker::Instance();
          SpeciesTracker::IncrementRibo
                    (pSVar6,&(((pIVar10->value).
                               super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                             super_FixedElement).gene_,1);
        }
      }
      bVar4 = std::operator==(&((pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr)->name_,"__rnase");
      if (bVar4) {
        pBVar9 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__cxx11::string::string((string *)&elem,"__ribosome",&local_c1);
        bVar4 = BindingSite::CheckInteraction(pBVar9,(string *)&elem);
        if (bVar4) {
          cVar1 = (((pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_FixedElement).field_0x9d;
          std::__cxx11::string::~string((string *)&elem);
          if (cVar1 == '\0') {
            pBVar9 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            if ((pBVar9->super_FixedElement).first_exposure_ == true) {
              pSVar6 = SpeciesTracker::Instance();
              SpeciesTracker::IncrementTranscript
                        (pSVar6,&(((pIVar10->value).
                                   super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->super_FixedElement).gene_,-1);
              pBVar9 = (pIVar10->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
            }
            BindingSite::Degrade(pBVar9);
          }
        }
        else {
          std::__cxx11::string::~string((string *)&elem);
        }
      }
    }
    std::__shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&pol->super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>);
    (*local_c0->_vptr_Polymer[3])(local_c0,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::
    vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::~vector(&results);
    return;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                 "MobileElement ",&peVar7->name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&elem,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&results,
                 " will overlap with mask upon promoter binding. This may cause the polymerase to stall and produce unexpected behavior."
                );
  std::__cxx11::string::~string((string *)&results);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&elem);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Polymer::Bind(MobileElement::Ptr pol, const std::string &promoter_name) {
  // Find a free promoter to bind to
  if (promoter_name == "readthrough") {
    pol->start(1);
    pol->stop(pol->footprint());
    pol->reading_frame(1);
  } else {
    auto elem = FindBindingSite(pol, promoter_name);
    // Update polymerase coordinates
    // (TODO: refactor; pol doesn't need to expose footprint/stop position)
    pol->start(elem->start());
    pol->stop(elem->start() + pol->footprint() - 1);
    pol->reading_frame(elem->reading_frame());
    // Only set gene_bound_ for transcripts and ribosomesinit
    if (pol->name() == "__ribosome") {
      pol->gene_bound(elem->gene());
    }
  }
  // More error checking.
  if (pol->stop() >= mask_.start()) {
    std::string err = "MobileElement " + pol->name() +
                      " will overlap with mask upon promoter binding. This may "
                      "cause the polymerase to stall and produce unexpected "
                      "behavior.";
    throw std::runtime_error(err);
  }
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    interval.value->Cover();
    if (interval.value->WasCovered()) {
      // Cover promoter in cache
      LogCover(interval.value->name());
    }
    interval.value->ResetState();
    // Report some data to tracker
    if (pol->name() != "__rnase" &&
        interval.value->CheckInteraction("__ribosome")) {
      auto &tracker = SpeciesTracker::Instance();
      tracker.IncrementRibo(interval.value->gene(), 1);
    }
    if (pol->name() == "__rnase" &&
        interval.value->CheckInteraction("__ribosome") &&
        interval.value->degraded() == false) {
      // Only decrement transcript count if this binding site has
      // been exposed and logged by SpeciesTracker before
      if (interval.value->first_exposure() == true) {
        auto &tracker = SpeciesTracker::Instance();
        tracker.IncrementTranscript(interval.value->gene(), -1);
      }
      interval.value->Degrade();
    }
  }
  // Add polymerase to this polymer
  Attach(pol);
}